

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes_compute_aabb(par_shapes_mesh *m,float *aabb)

{
  float fVar1;
  float *pfVar2;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  int local_24;
  float *pfStack_20;
  int i;
  float *points;
  float *aabb_local;
  par_shapes_mesh *m_local;
  
  pfVar2 = m->points;
  fVar1 = *pfVar2;
  aabb[3] = fVar1;
  *aabb = fVar1;
  fVar1 = pfVar2[1];
  aabb[4] = fVar1;
  aabb[1] = fVar1;
  fVar1 = pfVar2[2];
  aabb[5] = fVar1;
  aabb[2] = fVar1;
  for (local_24 = 1; pfStack_20 = pfVar2 + 3, local_24 < m->npoints; local_24 = local_24 + 1) {
    if (*pfStack_20 < *aabb || *pfStack_20 == *aabb) {
      local_28 = *pfStack_20;
    }
    else {
      local_28 = *aabb;
    }
    *aabb = local_28;
    if (pfVar2[4] < aabb[1] || pfVar2[4] == aabb[1]) {
      local_2c = pfVar2[4];
    }
    else {
      local_2c = aabb[1];
    }
    aabb[1] = local_2c;
    if (pfVar2[5] < aabb[2] || pfVar2[5] == aabb[2]) {
      local_30 = pfVar2[5];
    }
    else {
      local_30 = aabb[2];
    }
    aabb[2] = local_30;
    if (*pfStack_20 < aabb[3] || *pfStack_20 == aabb[3]) {
      local_34 = aabb[3];
    }
    else {
      local_34 = *pfStack_20;
    }
    aabb[3] = local_34;
    if (pfVar2[4] < aabb[4] || pfVar2[4] == aabb[4]) {
      local_38 = aabb[4];
    }
    else {
      local_38 = pfVar2[4];
    }
    aabb[4] = local_38;
    if (pfVar2[5] < aabb[5] || pfVar2[5] == aabb[5]) {
      local_3c = aabb[5];
    }
    else {
      local_3c = pfVar2[5];
    }
    aabb[5] = local_3c;
    pfVar2 = pfStack_20;
  }
  return;
}

Assistant:

PARDEF void par_shapes_compute_aabb(par_shapes_mesh const* m, float* aabb)
{
    float* points = m->points;
    aabb[0] = aabb[3] = points[0];
    aabb[1] = aabb[4] = points[1];
    aabb[2] = aabb[5] = points[2];
    points += 3;
    for (int i = 1; i < m->npoints; i++, points += 3) {
        aabb[0] = PAR_MIN(points[0], aabb[0]);
        aabb[1] = PAR_MIN(points[1], aabb[1]);
        aabb[2] = PAR_MIN(points[2], aabb[2]);
        aabb[3] = PAR_MAX(points[0], aabb[3]);
        aabb[4] = PAR_MAX(points[1], aabb[4]);
        aabb[5] = PAR_MAX(points[2], aabb[5]);
    }
}